

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVector256.cpp
# Opt level: O2

bool __thiscall jbcoin::STVector256::isEquivalent(STVector256 *this,STBase *t)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    bVar1 = std::operator==(&this->mValue,
                            (vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                             *)(lVar2 + 0x10));
    return bVar1;
  }
  return false;
}

Assistant:

bool
STVector256::isEquivalent (const STBase& t) const
{
    const STVector256* v = dynamic_cast<const STVector256*> (&t);
    return v && (mValue == v->mValue);
}